

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphBuilder.cpp
# Opt level: O1

void __thiscall
dg::vr::GraphBuilder::buildSwitch(GraphBuilder *this,SwitchInst *swtch,VRLocation *last)

{
  uint uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  mapped_type pVVar4;
  VRLocation *this_00;
  sockaddr *psVar5;
  mapped_type *ppVVar6;
  socklen_t __len;
  ulong uVar7;
  long lVar8;
  SwitchInst *pSVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  key_type local_48;
  undefined **local_40;
  GraphBuilder *local_38;
  
  uVar10 = (*(uint *)(swtch + 0x14) >> 1 & 0x3ffffff) - 1;
  if (uVar10 != 0) {
    local_38 = this + 0x10;
    lVar12 = 0;
    local_40 = &PTR__VROp_00136d40;
    do {
      this_00 = VRCodeGraph::newVRLocation(*(VRCodeGraph **)(this + 8));
      psVar5 = (sockaddr *)operator_new(0x20);
      uVar1 = *(uint *)(swtch + 0x14);
      if ((uVar1 >> 0x1e & 1) == 0) {
        pSVar9 = swtch + -(ulong)(uVar1 << 5);
      }
      else {
        pSVar9 = *(SwitchInst **)(swtch + -8);
      }
      uVar2 = *(undefined8 *)pSVar9;
      if ((uVar1 >> 0x1e & 1) == 0) {
        lVar11 = (long)swtch - (ulong)(uVar1 << 5);
      }
      else {
        lVar11 = *(long *)(swtch + -8);
      }
      uVar3 = *(undefined8 *)(lVar11 + (ulong)((int)lVar12 + 2) * 0x20);
      psVar5->sa_data[6] = '\x03';
      psVar5->sa_data[7] = '\0';
      psVar5->sa_data[8] = '\0';
      psVar5->sa_data[9] = '\0';
      psVar5[1].sa_family = (short)uVar2;
      psVar5[1].sa_data[0] = (char)((ulong)uVar2 >> 0x10);
      psVar5[1].sa_data[1] = (char)((ulong)uVar2 >> 0x18);
      psVar5[1].sa_data[2] = (char)((ulong)uVar2 >> 0x20);
      psVar5[1].sa_data[3] = (char)((ulong)uVar2 >> 0x28);
      psVar5[1].sa_data[4] = (char)((ulong)uVar2 >> 0x30);
      psVar5[1].sa_data[5] = (char)((ulong)uVar2 >> 0x38);
      *(undefined ***)psVar5 = local_40;
      *(undefined8 *)(psVar5[1].sa_data + 6) = uVar3;
      VRLocation::connect(last,(int)this_00,psVar5,(socklen_t)uVar3);
      if ((*(uint *)(swtch + 0x14) >> 0x1e & 1) == 0) {
        lVar11 = (long)swtch - (ulong)(*(uint *)(swtch + 0x14) << 5);
      }
      else {
        lVar11 = *(long *)(swtch + -8);
      }
      uVar7 = (ulong)((int)lVar12 + 3);
      if (lVar12 == 0x1fffffffc) {
        uVar7 = 1;
      }
      lVar8 = uVar7 * 0x20;
      local_48 = *(key_type *)(lVar11 + lVar8);
      ppVVar6 = std::
                map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                              *)local_38,&local_48);
      __len = (socklen_t)lVar8;
      pVVar4 = *ppVVar6;
      psVar5 = (sockaddr *)operator_new(0x10);
      psVar5->sa_data[6] = '\0';
      psVar5->sa_data[7] = '\0';
      psVar5->sa_data[8] = '\0';
      psVar5->sa_data[9] = '\0';
      *(undefined ***)psVar5 = &PTR__VROp_00136cc0;
      VRLocation::connect(this_00,(int)pVVar4,psVar5,__len);
      lVar12 = lVar12 + 2;
    } while ((ulong)uVar10 * 2 != lVar12);
  }
  if ((*(uint *)(swtch + 0x14) >> 0x1e & 1) == 0) {
    lVar12 = (long)swtch - (ulong)(*(uint *)(swtch + 0x14) << 5);
  }
  else {
    lVar12 = *(long *)(swtch + -8);
  }
  local_48 = *(key_type *)(lVar12 + 0x20);
  ppVVar6 = std::
            map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
            ::operator[]((map<const_llvm::BasicBlock_*,_dg::vr::VRLocation_*,_std::less<const_llvm::BasicBlock_*>,_std::allocator<std::pair<const_llvm::BasicBlock_*const,_dg::vr::VRLocation_*>_>_>
                          *)(this + 0x10),&local_48);
  pVVar4 = *ppVVar6;
  psVar5 = (sockaddr *)operator_new(0x10);
  psVar5->sa_data[6] = '\0';
  psVar5->sa_data[7] = '\0';
  psVar5->sa_data[8] = '\0';
  psVar5->sa_data[9] = '\0';
  *(undefined ***)psVar5 = &PTR__VROp_00136cc0;
  VRLocation::connect(last,(int)pVVar4,psVar5,0x136cc0);
  return;
}

Assistant:

void GraphBuilder::buildSwitch(const llvm::SwitchInst *swtch,
                               VRLocation &last) {
    for (auto &it : swtch->cases()) {
        VRLocation &padding = codeGraph.newVRLocation();

        last.connect(padding, new VRAssumeEqual(swtch->getCondition(),
                                                it.getCaseValue()));

        assert(fronts.find(it.getCaseSuccessor()) != fronts.end());
        VRLocation &first = *fronts[it.getCaseSuccessor()];

        padding.connect(first, new VRNoop());
    }

    assert(fronts.find(swtch->getDefaultDest()) != fronts.end());
    VRLocation &first = *fronts[swtch->getDefaultDest()];
    last.connect(first, new VRNoop());
}